

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<std::__cxx11::string&,char>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  char local_28 [32];
  
  local_70.first._M_str = (a->_M_dataplus)._M_p;
  local_70.first._M_len = a->_M_string_length;
  local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28[0] = *b;
  local_50 = local_28;
  local_40 = 0;
  local_38 = 1;
  local_58 = 1;
  local_48 = 0;
  views._M_len = 2;
  views._M_array = &local_70;
  local_30 = local_50;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}